

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLTokenizer.cpp
# Opt level: O0

TokenListType * __thiscall
Diligent::Parsing::HLSLTokenizer::Tokenize
          (TokenListType *__return_storage_ptr__,HLSLTokenizer *this,String *Source)

{
  anon_class_8_1_8991fb9c in_R9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  size_t TokenIdx;
  String *Source_local;
  HLSLTokenizer *this_local;
  
  local_28._M_current = (char *)0x0;
  TokenIdx = (size_t)Source;
  Source_local = (String *)this;
  this_local = (HLSLTokenizer *)__return_storage_ptr__;
  local_30 = std::__cxx11::string::begin();
  local_38._M_current = (char *)std::__cxx11::string::end();
  Tokenize<Diligent::Parsing::HLSLTokenInfo,std::__cxx11::list<Diligent::Parsing::HLSLTokenInfo,std::allocator<Diligent::Parsing::HLSLTokenInfo>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,Diligent::Parsing::HLSLTokenizer::Tokenize(std::__cxx11::string_const&)const::__0,Diligent::Parsing::HLSLTokenizer::Tokenize(std::__cxx11::string_const&)const::__1>
            (__return_storage_ptr__,(Parsing *)&local_30,&local_38,&local_28,
             (anon_class_8_1_a9fb7fa2)this,in_R9);
  return __return_storage_ptr__;
}

Assistant:

HLSLTokenizer::TokenListType HLSLTokenizer::Tokenize(const String& Source) const
{
    try
    {
        size_t TokenIdx = 0;
        return Parsing::Tokenize<HLSLTokenInfo, TokenListType>(
            Source.begin(), Source.end(),
            [&TokenIdx](HLSLTokenType                      Type,
                        const std::string::const_iterator& DelimStart,
                        const std::string::const_iterator& DelimEnd,
                        const std::string::const_iterator& LiteralStart,
                        const std::string::const_iterator& LiteralEnd) //
            {
                return HLSLTokenInfo::Create(Type, DelimStart, DelimEnd, LiteralStart, LiteralEnd, TokenIdx++);
            },
            [&](const std::string::const_iterator& Start, const std::string::const_iterator& End) //
            {
                auto KeywordIt = m_Keywords.find(HashMapStringKey{std::string{Start, End}});
                if (KeywordIt != m_Keywords.end())
                {
                    VERIFY(std::string(Start, End) == KeywordIt->second.Literal, "Inconsistent literal");
                    return KeywordIt->second.Type;
                }
                return HLSLTokenType::Identifier;
            });
    }
    catch (...)
    {
        return {};
    }
}